

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inmemorybenchmark.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  reference pbVar4;
  pointer pbVar5;
  char *pcVar6;
  ostream *poVar7;
  size_type sVar8;
  int __oflag;
  long in_RSI;
  code *this;
  int in_EDI;
  undefined1 auVar9 [16];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  processparameters pp;
  size_t datastotalsize;
  vector<std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>,_std::allocator<std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>_>_>
  datas;
  size_t MAXBLOCKSIZE;
  size_t counter;
  vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_> rawdata;
  MaropuGapReader reader;
  string filename;
  string namewithoutprefix;
  iterator i_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  codecslst;
  string codecsstr;
  int option_index;
  int c;
  iterator i;
  vector<FastPForLib::algostats,_std::allocator<FastPForLib::algostats>_> myalgos;
  vector<std::shared_ptr<FastPForLib::IntegerCODEC>,_std::allocator<std::shared_ptr<FastPForLib::IntegerCODEC>_>_>
  tmp;
  CODECFactory factory;
  size_t MAXCOUNTER;
  size_t MAXLENGTH;
  size_t MINLENGTH;
  bool separatedeltatimes;
  bool splitlongarrays;
  undefined4 in_stack_fffffffffffff3b8;
  undefined4 in_stack_fffffffffffff3bc;
  algostats *in_stack_fffffffffffff3c0;
  value_type *in_stack_fffffffffffff3c8;
  allocator *paVar12;
  ostream *in_stack_fffffffffffff3d0;
  undefined8 in_stack_fffffffffffff3e0;
  shared_ptr<FastPForLib::IntegerCODEC> *in_stack_fffffffffffff3e8;
  algostats *in_stack_fffffffffffff3f0;
  CODECFactory *in_stack_fffffffffffff3f8;
  algostats *in_stack_fffffffffffff408;
  undefined4 in_stack_fffffffffffff410;
  _Setprecision in_stack_fffffffffffff414;
  MaropuGapReader *in_stack_fffffffffffff418;
  string *in_stack_fffffffffffff440;
  CODECFactory *in_stack_fffffffffffff448;
  ostream *in_stack_fffffffffffff468;
  ostream *in_stack_fffffffffffff470;
  allocator local_aa1;
  string local_aa0 [39];
  allocator local_a79;
  string local_a78 [38];
  processparameters local_a52;
  int local_a4c;
  ulong local_a48;
  vector<std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>,_std::allocator<std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>_>_>
  local_a40;
  undefined8 local_a28;
  ulong local_a20;
  vector<std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>,_std::allocator<std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>_>_>
  local_a18;
  MaropuGapReader local_a00;
  allocator local_9d1;
  vector<std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>,_std::allocator<std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>_>_>
  local_9d0;
  int local_9ac;
  string local_9a8 [32];
  string local_988 [224];
  string local_8a8 [16];
  string *in_stack_fffffffffffff768;
  vector<FastPForLib::algostats,_std::allocator<FastPForLib::algostats>_> *in_stack_fffffffffffff770
  ;
  string local_7c8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_7a8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_7a0;
  allocator local_791;
  string local_790 [63];
  allocator local_751;
  string local_750 [39];
  allocator local_729;
  string *in_stack_fffffffffffff8d8;
  processparameters *in_stack_fffffffffffff8e0;
  vector<std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>,_std::allocator<std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>_>_>
  *in_stack_fffffffffffff8e8;
  vector<FastPForLib::algostats,_std::allocator<FastPForLib::algostats>_> *in_stack_fffffffffffff8f0
  ;
  istringstream local_708 [391];
  allocator local_581;
  string local_580 [32];
  istringstream local_560 [391];
  allocator local_3d9;
  string local_3d8 [32];
  istringstream local_3b8 [384];
  undefined4 local_238;
  int local_234;
  shared_ptr<FastPForLib::IntegerCODEC> *local_b0;
  __normal_iterator<std::shared_ptr<FastPForLib::IntegerCODEC>_*,_std::vector<std::shared_ptr<FastPForLib::IntegerCODEC>,_std::allocator<std::shared_ptr<FastPForLib::IntegerCODEC>_>_>_>
  local_a8 [15];
  unsigned_long local_30;
  ulong local_28;
  ulong local_20;
  byte local_12;
  byte local_11;
  long local_10;
  int local_8;
  int local_4;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  
  local_4 = 0;
  if (in_EDI < 2) {
    message((char *)in_stack_fffffffffffff440);
    local_4 = -1;
  }
  else {
    local_11 = 1;
    local_12 = 0;
    local_20 = 1;
    local_10 = in_RSI;
    local_8 = in_EDI;
    uVar2 = std::numeric_limits<unsigned_int>::max();
    local_28 = (ulong)uVar2;
    local_30 = std::numeric_limits<unsigned_long>::max();
    FastPForLib::CODECFactory::CODECFactory((CODECFactory *)0x108b28);
    FastPForLib::CODECFactory::allSchemes(in_stack_fffffffffffff3f8);
    std::vector<FastPForLib::algostats,_std::allocator<FastPForLib::algostats>_>::vector
              ((vector<FastPForLib::algostats,_std::allocator<FastPForLib::algostats>_> *)0x108b4c);
    local_a8[0]._M_current =
         (shared_ptr<FastPForLib::IntegerCODEC> *)
         std::
         vector<std::shared_ptr<FastPForLib::IntegerCODEC>,_std::allocator<std::shared_ptr<FastPForLib::IntegerCODEC>_>_>
         ::begin((vector<std::shared_ptr<FastPForLib::IntegerCODEC>,_std::allocator<std::shared_ptr<FastPForLib::IntegerCODEC>_>_>
                  *)CONCAT44(in_stack_fffffffffffff3bc,in_stack_fffffffffffff3b8));
    while( true ) {
      local_b0 = (shared_ptr<FastPForLib::IntegerCODEC> *)
                 std::
                 vector<std::shared_ptr<FastPForLib::IntegerCODEC>,_std::allocator<std::shared_ptr<FastPForLib::IntegerCODEC>_>_>
                 ::end((vector<std::shared_ptr<FastPForLib::IntegerCODEC>,_std::allocator<std::shared_ptr<FastPForLib::IntegerCODEC>_>_>
                        *)CONCAT44(in_stack_fffffffffffff3bc,in_stack_fffffffffffff3b8));
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<std::shared_ptr<FastPForLib::IntegerCODEC>_*,_std::vector<std::shared_ptr<FastPForLib::IntegerCODEC>,_std::allocator<std::shared_ptr<FastPForLib::IntegerCODEC>_>_>_>
                          *)in_stack_fffffffffffff3c0,
                         (__normal_iterator<std::shared_ptr<FastPForLib::IntegerCODEC>_*,_std::vector<std::shared_ptr<FastPForLib::IntegerCODEC>,_std::allocator<std::shared_ptr<FastPForLib::IntegerCODEC>_>_>_>
                          *)CONCAT44(in_stack_fffffffffffff3bc,in_stack_fffffffffffff3b8));
      if (!bVar1) break;
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<FastPForLib::IntegerCODEC>_*,_std::vector<std::shared_ptr<FastPForLib::IntegerCODEC>,_std::allocator<std::shared_ptr<FastPForLib::IntegerCODEC>_>_>_>
      ::operator*(local_a8);
      FastPForLib::algostats::algostats
                (in_stack_fffffffffffff3f0,in_stack_fffffffffffff3e8,
                 SUB81((ulong)in_stack_fffffffffffff3e0 >> 0x38,0));
      std::vector<FastPForLib::algostats,_std::allocator<FastPForLib::algostats>_>::push_back
                ((vector<FastPForLib::algostats,_std::allocator<FastPForLib::algostats>_> *)
                 in_stack_fffffffffffff3c0,
                 (value_type *)CONCAT44(in_stack_fffffffffffff3bc,in_stack_fffffffffffff3b8));
      FastPForLib::algostats::~algostats(in_stack_fffffffffffff3c0);
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<FastPForLib::IntegerCODEC>_*,_std::vector<std::shared_ptr<FastPForLib::IntegerCODEC>,_std::allocator<std::shared_ptr<FastPForLib::IntegerCODEC>_>_>_>
      ::operator*(local_a8);
      FastPForLib::algostats::algostats
                (in_stack_fffffffffffff3f0,in_stack_fffffffffffff3e8,
                 SUB81((ulong)in_stack_fffffffffffff3e0 >> 0x38,0));
      std::vector<FastPForLib::algostats,_std::allocator<FastPForLib::algostats>_>::push_back
                ((vector<FastPForLib::algostats,_std::allocator<FastPForLib::algostats>_> *)
                 in_stack_fffffffffffff3c0,
                 (value_type *)CONCAT44(in_stack_fffffffffffff3bc,in_stack_fffffffffffff3b8));
      FastPForLib::algostats::~algostats(in_stack_fffffffffffff3c0);
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<FastPForLib::IntegerCODEC>_*,_std::vector<std::shared_ptr<FastPForLib::IntegerCODEC>,_std::allocator<std::shared_ptr<FastPForLib::IntegerCODEC>_>_>_>
      ::operator++(local_a8);
    }
    while( true ) {
      local_238 = 0;
      local_234 = getopt_long(local_8,local_10,"DSc:n:m:M:",long_options);
      pcVar6 = _optarg;
      if (local_234 == -1) break;
      switch(local_234) {
      case 0x44:
        poVar7 = std::operator<<((ostream *)&std::cout,
                                 "# Outputting separate delta and inverseDelta times.");
        std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
        local_12 = 1;
        break;
      default:
        in_stack_fffffffffffff468 = std::operator<<((ostream *)&std::cerr,"unrecognized flag");
        std::ostream::operator<<(in_stack_fffffffffffff468,std::endl<char,std::char_traits<char>>);
        break;
      case 0x4d:
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_580,pcVar6,&local_581);
        std::__cxx11::istringstream::istringstream(local_560,local_580,8);
        std::operator>>((basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        in_stack_fffffffffffff3c0,
                        (unsigned_long *)
                        CONCAT44(in_stack_fffffffffffff3bc,in_stack_fffffffffffff3b8));
        std::__cxx11::istringstream::~istringstream(local_560);
        std::__cxx11::string::~string(local_580);
        std::allocator<char>::~allocator((allocator<char> *)&local_581);
        poVar7 = std::operator<<((ostream *)&std::cout,"# MAXLENGTH = ");
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_28);
        std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
        break;
      case 0x53:
        poVar7 = std::operator<<((ostream *)&std::cout,
                                 "#\n# disabling partition of big arrays. Performance may suffer.\n#"
                                );
        std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
        local_11 = 0;
        break;
      case 99:
        std::vector<FastPForLib::algostats,_std::allocator<FastPForLib::algostats>_>::clear
                  ((vector<FastPForLib::algostats,_std::allocator<FastPForLib::algostats>_> *)
                   0x1091eb);
        pcVar6 = _optarg;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_750,pcVar6,&local_751);
        std::allocator<char>::~allocator((allocator<char> *)&local_751);
        iVar3 = std::__cxx11::string::compare((char *)local_750);
        if (iVar3 != 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_790,",:;",&local_791);
          FastPForLib::split(&in_stack_fffffffffffff418->mFilename,
                             (string *)
                             CONCAT44(in_stack_fffffffffffff414._M_n,in_stack_fffffffffffff410));
          std::__cxx11::string::~string(local_790);
          std::allocator<char>::~allocator((allocator<char> *)&local_791);
          local_7a0._M_current =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)CONCAT44(in_stack_fffffffffffff3bc,in_stack_fffffffffffff3b8));
          while( true ) {
            local_7a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)CONCAT44(in_stack_fffffffffffff3bc,in_stack_fffffffffffff3b8));
            bVar1 = __gnu_cxx::operator!=
                              ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)in_stack_fffffffffffff3c0,
                               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)CONCAT44(in_stack_fffffffffffff3bc,in_stack_fffffffffffff3b8));
            if (!bVar1) break;
            poVar7 = std::operator<<((ostream *)&std::cout,"# pretty name = ");
            pbVar4 = __gnu_cxx::
                     __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator*(&local_7a0);
            poVar7 = std::operator<<(poVar7,(string *)pbVar4);
            std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
            pbVar5 = __gnu_cxx::
                     __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator->(&local_7a0);
            pcVar6 = (char *)std::__cxx11::string::at((ulong)pbVar5);
            if (*pcVar6 == '@') {
              pbVar5 = __gnu_cxx::
                       __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator->(&local_7a0);
              __gnu_cxx::
              __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator->(&local_7a0);
              std::__cxx11::string::size();
              std::__cxx11::string::substr((ulong)local_7c8,(ulong)pbVar5);
              std::__cxx11::string::string(local_8a8,local_7c8);
              FastPForLib::CODECFactory::getFromName
                        (in_stack_fffffffffffff448,in_stack_fffffffffffff440);
              FastPForLib::algostats::algostats
                        (in_stack_fffffffffffff3f0,in_stack_fffffffffffff3e8,
                         SUB81((ulong)in_stack_fffffffffffff3e0 >> 0x38,0));
              std::vector<FastPForLib::algostats,_std::allocator<FastPForLib::algostats>_>::
              push_back((vector<FastPForLib::algostats,_std::allocator<FastPForLib::algostats>_> *)
                        in_stack_fffffffffffff3c0,
                        (value_type *)CONCAT44(in_stack_fffffffffffff3bc,in_stack_fffffffffffff3b8))
              ;
              FastPForLib::algostats::~algostats(in_stack_fffffffffffff3c0);
              std::__cxx11::string::~string(local_8a8);
              std::__cxx11::string::~string(local_7c8);
            }
            else {
              pbVar4 = __gnu_cxx::
                       __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator*(&local_7a0);
              std::__cxx11::string::string(local_988,(string *)pbVar4);
              FastPForLib::CODECFactory::getFromName
                        (in_stack_fffffffffffff448,in_stack_fffffffffffff440);
              FastPForLib::algostats::algostats
                        (in_stack_fffffffffffff3f0,in_stack_fffffffffffff3e8,
                         SUB81((ulong)in_stack_fffffffffffff3e0 >> 0x38,0));
              std::vector<FastPForLib::algostats,_std::allocator<FastPForLib::algostats>_>::
              push_back((vector<FastPForLib::algostats,_std::allocator<FastPForLib::algostats>_> *)
                        in_stack_fffffffffffff3c0,
                        (value_type *)CONCAT44(in_stack_fffffffffffff3bc,in_stack_fffffffffffff3b8))
              ;
              FastPForLib::algostats::~algostats(in_stack_fffffffffffff3c0);
              std::__cxx11::string::~string(local_988);
            }
            poVar7 = std::operator<<((ostream *)&std::cout,"# added \'");
            std::vector<FastPForLib::algostats,_std::allocator<FastPForLib::algostats>_>::back
                      ((vector<FastPForLib::algostats,_std::allocator<FastPForLib::algostats>_> *)
                       in_stack_fffffffffffff3c0);
            FastPForLib::algostats::name_abi_cxx11_(in_stack_fffffffffffff408);
            poVar7 = std::operator<<(poVar7,local_9a8);
            in_stack_fffffffffffff470 = std::operator<<(poVar7,"\'");
            std::ostream::operator<<
                      (in_stack_fffffffffffff470,std::endl<char,std::char_traits<char>>);
            std::__cxx11::string::~string(local_9a8);
            __gnu_cxx::
            __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator++(&local_7a0);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffff3d0);
        }
        std::__cxx11::string::~string(local_750);
        break;
      case 0x6d:
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_3d8,pcVar6,&local_3d9);
        std::__cxx11::istringstream::istringstream(local_3b8,local_3d8,8);
        std::operator>>((basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        in_stack_fffffffffffff3c0,
                        (unsigned_long *)
                        CONCAT44(in_stack_fffffffffffff3bc,in_stack_fffffffffffff3b8));
        std::__cxx11::istringstream::~istringstream(local_3b8);
        std::__cxx11::string::~string(local_3d8);
        std::allocator<char>::~allocator((allocator<char> *)&local_3d9);
        poVar7 = std::operator<<((ostream *)&std::cout,"# MINLENGTH = ");
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_20);
        std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
        break;
      case 0x6e:
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&stack0xfffffffffffff8d8,pcVar6,&local_729);
        std::__cxx11::istringstream::istringstream(local_708,&stack0xfffffffffffff8d8,8);
        std::operator>>((basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        in_stack_fffffffffffff3c0,
                        (unsigned_long *)
                        CONCAT44(in_stack_fffffffffffff3bc,in_stack_fffffffffffff3b8));
        std::__cxx11::istringstream::~istringstream(local_708);
        std::__cxx11::string::~string((string *)&stack0xfffffffffffff8d8);
        std::allocator<char>::~allocator((allocator<char> *)&local_729);
        poVar7 = std::operator<<((ostream *)&std::cout,"# MAXCOUNTER = ");
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_30);
        std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      }
    }
    if (local_8 - _optind < 1) {
      poVar7 = std::operator<<((ostream *)&std::cerr,"  you must specify a file ");
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      local_4 = -1;
      local_9ac = 1;
    }
    else {
      pcVar6 = *(char **)(local_10 + (long)_optind * 8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_9d0,pcVar6,&local_9d1);
      std::allocator<char>::~allocator((allocator<char> *)&local_9d1);
      poVar7 = std::operator<<((ostream *)&std::cout,"# parsing ");
      poVar7 = std::operator<<(poVar7,(string *)&local_9d0);
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      this = (code *)&local_9d0;
      FastPForLib::MaropuGapReader::MaropuGapReader
                ((MaropuGapReader *)in_stack_fffffffffffff3c0,
                 (string *)CONCAT44(in_stack_fffffffffffff3bc,in_stack_fffffffffffff3b8));
      std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>::vector
                ((vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_> *)
                 0x1098d2);
      FastPForLib::MaropuGapReader::open(&local_a00,(char *)this,__oflag);
      local_a20 = 0;
      local_a28 = 0x6400000;
      do {
        iVar3 = (int)this;
        if (local_30 <= local_a20) break;
        std::
        vector<std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>,_std::allocator<std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>_>_>
        ::vector((vector<std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>,_std::allocator<std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>_>_>
                  *)0x10991e);
        local_a48 = 0;
        poVar7 = std::operator<<((ostream *)&std::cout,"# Filling up a block ");
        auVar10._0_8_ = std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
        auVar10._8_56_ = extraout_var;
        do {
          do {
            this = (code *)&local_a18;
            bVar1 = FastPForLib::MaropuGapReader::
                    loadIntegers<std::vector<unsigned_int,FastPForLib::AlignedSTLAllocator<unsigned_int,64ul>>>
                              (in_stack_fffffffffffff418,
                               (vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>
                                *)CONCAT44(in_stack_fffffffffffff414._M_n,in_stack_fffffffffffff410)
                              );
            auVar9 = auVar10._0_16_;
            if (!bVar1) goto LAB_00109aea;
            sVar8 = std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>
                    ::size((vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>
                            *)&local_a18);
          } while ((sVar8 < local_20) ||
                  (sVar8 = std::
                           vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>
                           ::size((vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>
                                   *)&local_a18), local_28 < sVar8));
          local_a20 = local_a20 + 1;
          this = (code *)&local_a18;
          sVar8 = std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>::
                  size((vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>
                        *)this);
          local_a48 = local_a48 + sVar8;
          std::
          vector<std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>,_std::allocator<std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>_>_>
          ::push_back((vector<std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>,_std::allocator<std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>_>_>
                       *)in_stack_fffffffffffff3d0,in_stack_fffffffffffff3c8);
          auVar9 = auVar10._0_16_;
          if (local_30 <= local_a20) {
            poVar7 = std::operator<<((ostream *)&std::cout,"#breaking early");
            this = std::endl<char,std::char_traits<char>>;
            auVar11._0_8_ = std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
            auVar11._8_56_ = extraout_var_00;
            auVar9 = auVar11._0_16_;
            break;
          }
        } while (local_a48 < 0x6400000);
LAB_00109aea:
        if (local_a48 == 0) {
          local_9ac = 0xc;
        }
        else {
          in_stack_fffffffffffff418 =
               (MaropuGapReader *)std::operator<<((ostream *)&std::cout,"# read ");
          in_stack_fffffffffffff414 = std::setprecision(3);
          local_a4c = in_stack_fffffffffffff414._M_n;
          poVar7 = std::operator<<((ostream *)in_stack_fffffffffffff418,in_stack_fffffffffffff414);
          auVar9 = vcvtusi2sd_avx512f(auVar9,local_a48);
          poVar7 = (ostream *)
                   std::ostream::operator<<(poVar7,auVar9._0_8_ * 4.0 * 9.5367431640625e-07);
          poVar7 = std::operator<<(poVar7," MB, ");
          sVar8 = std::
                  vector<std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>,_std::allocator<std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>_>_>
                  ::size(&local_a40);
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,sVar8);
          poVar7 = std::operator<<(poVar7," arrays.");
          std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
          poVar7 = std::operator<<((ostream *)&std::cout,"# processing block");
          std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
          if ((local_11 & 1) != 0) {
            FastPForLib::
            splitLongArrays<std::vector<unsigned_int,FastPForLib::AlignedSTLAllocator<unsigned_int,64ul>>>
                      ((vector<std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>,_std::allocator<std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>_>_>
                        *)in_stack_fffffffffffff470,(size_t)in_stack_fffffffffffff468);
          }
          FastPForLib::processparameters::processparameters
                    (&local_a52,true,false,false,false,true,(bool)(local_12 & 1));
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_a78,"",&local_a79);
          this = (code *)&local_a40;
          FastPForLib::Delta::
          process<std::vector<unsigned_int,FastPForLib::AlignedSTLAllocator<unsigned_int,64ul>>>
                    (in_stack_fffffffffffff8f0,in_stack_fffffffffffff8e8,in_stack_fffffffffffff8e0,
                     in_stack_fffffffffffff8d8);
          std::__cxx11::string::~string(local_a78);
          std::allocator<char>::~allocator((allocator<char> *)&local_a79);
          local_9ac = 0;
        }
        std::
        vector<std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>,_std::allocator<std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>_>_>
        ::~vector((vector<std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>,_std::allocator<std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>_>_>
                   *)in_stack_fffffffffffff3d0);
        iVar3 = (int)this;
      } while (local_9ac == 0);
      FastPForLib::MaropuGapReader::close(&local_a00,iVar3);
      in_stack_fffffffffffff3d0 = std::operator<<((ostream *)&std::cout,"# build summary...");
      std::ostream::operator<<(in_stack_fffffffffffff3d0,std::endl<char,std::char_traits<char>>);
      paVar12 = &local_aa1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_aa0,"#",paVar12);
      FastPForLib::summarize(in_stack_fffffffffffff770,in_stack_fffffffffffff768);
      std::__cxx11::string::~string(local_aa0);
      std::allocator<char>::~allocator((allocator<char> *)&local_aa1);
      std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>::~vector
                ((vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_> *)
                 in_stack_fffffffffffff3d0);
      FastPForLib::MaropuGapReader::~MaropuGapReader((MaropuGapReader *)in_stack_fffffffffffff3c0);
      std::__cxx11::string::~string((string *)&local_9d0);
      local_9ac = 0;
    }
    std::vector<FastPForLib::algostats,_std::allocator<FastPForLib::algostats>_>::~vector
              ((vector<FastPForLib::algostats,_std::allocator<FastPForLib::algostats>_> *)
               in_stack_fffffffffffff3d0);
    std::
    vector<std::shared_ptr<FastPForLib::IntegerCODEC>,_std::allocator<std::shared_ptr<FastPForLib::IntegerCODEC>_>_>
    ::~vector((vector<std::shared_ptr<FastPForLib::IntegerCODEC>,_std::allocator<std::shared_ptr<FastPForLib::IntegerCODEC>_>_>
               *)in_stack_fffffffffffff3d0);
    FastPForLib::CODECFactory::~CODECFactory((CODECFactory *)0x109e48);
  }
  return local_4;
}

Assistant:

int main(int argc, char **argv) {
  if (argc < 2) {
    message(argv[0]);
    return -1;
  }
  bool splitlongarrays = true;
  bool separatedeltatimes = false;
  size_t MINLENGTH = 1;
  size_t MAXLENGTH = (std::numeric_limits<uint32_t>::max)();
  size_t MAXCOUNTER = (std::numeric_limits<std::size_t>::max)();
  CODECFactory factory;
  vector<shared_ptr<IntegerCODEC>> tmp =
      factory.allSchemes(); // the default
  vector<algostats> myalgos;
  for (auto i = tmp.begin(); i != tmp.end(); ++i) {
    myalgos.push_back(algostats(*i));
    myalgos.push_back(algostats(*i, true)); // by default?
  }
  int c;
  while (1) {
    int option_index = 0;
    c = getopt_long(argc, argv, "DSc:n:m:M:", long_options, &option_index);
    if (c == -1)
      break;
    switch (c) {
    case 'D':
      cout << "# Outputting separate delta and inverseDelta times." << endl;
      separatedeltatimes = true;
      break;
    case 'S':
      cout << "#\n# disabling partition of big arrays. Performance may "
              "suffer.\n#"
           << endl;
      splitlongarrays = false;
      break;
    case 'm':
      istringstream(optarg) >> MINLENGTH;
      cout << "# MINLENGTH = " << MINLENGTH << endl;
      break;
    case 'M':
      istringstream(optarg) >> MAXLENGTH;
      cout << "# MAXLENGTH = " << MAXLENGTH << endl;
      break;
    case 'n':
      istringstream(optarg) >> MAXCOUNTER;
      cout << "# MAXCOUNTER = " << MAXCOUNTER << endl;
      break;
    case 'c': {
      myalgos.clear();
      string codecsstr(optarg);
      if (codecsstr.compare("NONE") != 0) {
        vector<string> codecslst = split(codecsstr, ",:;");
        for (auto i = codecslst.begin(); i != codecslst.end(); ++i) {
          cout << "# pretty name = " << *i << endl;
          if (i->at(0) == '@') { // SIMD
            string namewithoutprefix = i->substr(1, i->size() - 1);
            myalgos.push_back(
                algostats(factory.getFromName(namewithoutprefix), true));
          } else {
            myalgos.push_back(algostats(factory.getFromName(*i)));
          }
          cout << "# added '" << myalgos.back().name() << "'" << endl;
        }
      }
    } break;
    default:
      cerr << "unrecognized flag" << endl;
      break;
    }
  }

  if (argc - optind < 1) {
    cerr << "  you must specify a file " << endl;
    return -1;
  }
  string filename = argv[optind];

  cout << "# parsing " << filename << endl;
  MaropuGapReader reader(filename);

  vector<uint32_t, cacheallocator> rawdata;
  reader.open();
  size_t counter = 0;
  const size_t MAXBLOCKSIZE = 104857600; // 400 MB
  while (counter < MAXCOUNTER) {
    // collecting the data up to MAXBLOCKSIZE integers
    vector<vector<uint32_t, cacheallocator>> datas;
    size_t datastotalsize = 0;
    cout << "# Filling up a block " << endl;
    while (reader.loadIntegers(rawdata)) {
      if ((rawdata.size() < MINLENGTH) || (rawdata.size() > MAXLENGTH))
        continue;
      ++counter;
      datastotalsize += rawdata.size();
      datas.push_back(rawdata);
      if (counter >= MAXCOUNTER) {
        cout << "#breaking early" << endl;
        break;
      }
      if (datastotalsize >= MAXBLOCKSIZE)
        break;
    }
    if (datastotalsize == 0)
      break;
    cout << "# read " << std::setprecision(3)
         << static_cast<double>(datastotalsize) * 4.0 / (1024.0 * 1024.0)
         << " MB, " << datas.size() << " arrays." << endl;

    cout << "# processing block" << endl;
    if (splitlongarrays)
      splitLongArrays(datas);
    processparameters pp(true, false, false, false, true, separatedeltatimes);
    Delta::process(myalgos, datas,
                   pp); // done collecting data, now allocating memory
  }
  reader.close();
  cout << "# build summary..." << endl;
  summarize(myalgos);
}